

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O3

_Bool string_split(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar2;
  char *pcVar3;
  gravity_value_t *pgVar4;
  uint len;
  undefined6 in_register_00000012;
  ulong slen;
  _Bool _Var5;
  char *pcVar6;
  char *pcVar7;
  gravity_class_t *s;
  uint32_t uVar9;
  uint uVar10;
  gravity_value_t value;
  gravity_value_t gVar11;
  char _buffer [4096];
  char local_1038 [4104];
  gravity_class_t *pgVar8;
  
  if (((int)CONCAT62(in_register_00000012,nargs) == 2) && (args[1].isa == gravity_class_string)) {
    pgVar1 = (args->field_1).p;
    pgVar8 = (args[1].field_1.p)->objclass;
    uVar10 = *(uint *)((long)&(args[1].field_1.p)->identifier + 4);
    gravity_gc_setenabled(vm,false);
    aVar2.p = (gravity_object_t *)gravity_list_new(vm,0);
    s = pgVar1->objclass;
    len = *(uint *)((long)&pgVar1->identifier + 4);
    slen = (ulong)len;
    if ((ulong)uVar10 == 0) {
      if (len != 0) {
        uVar10 = 0;
        do {
          uVar9 = utf8_charbytes((char *)s,0);
          pcVar3 = (char *)((gravity_value_r *)&(aVar2.p)->objclass)->n;
          pgVar4 = *(gravity_value_t **)&(aVar2.p)->has_outer;
          if (pcVar3 == (aVar2.p)->identifier) {
            pcVar7 = (char *)((long)pcVar3 * 2);
            if (pcVar3 == (char *)0x0) {
              pcVar7 = (char *)0x8;
            }
            (aVar2.p)->identifier = pcVar7;
            pgVar4 = (gravity_value_t *)realloc(pgVar4,(long)pcVar7 << 4);
            *(gravity_value_t **)&(aVar2.p)->has_outer = pgVar4;
            pcVar3 = (char *)((gravity_value_r *)&(aVar2.p)->objclass)->n;
          }
          ((gravity_value_r *)&(aVar2.p)->objclass)->n = (size_t)(pcVar3 + 1);
          gVar11 = gravity_string_to_value(vm,(char *)s,uVar9);
          pgVar4[(long)pcVar3].isa = gVar11.isa;
          pgVar4[(long)pcVar3].field_1.n = (gravity_int_t)gVar11.field_1;
          s = (gravity_class_t *)((long)&s->isa + (ulong)uVar9);
          uVar10 = uVar10 + uVar9;
        } while (uVar10 < len);
      }
      gravity_gc_setenabled(vm,true);
      pgVar8 = (aVar2.p)->isa;
    }
    else {
      pcVar3 = string_strnstr((char *)s,(char *)pgVar8,slen);
      while (pcVar3 != (char *)0x0) {
        pcVar7 = (char *)((gravity_value_r *)&(aVar2.p)->objclass)->n;
        pgVar4 = *(gravity_value_t **)&(aVar2.p)->has_outer;
        if (pcVar7 == (aVar2.p)->identifier) {
          pcVar6 = (char *)((long)pcVar7 * 2);
          if (pcVar7 == (char *)0x0) {
            pcVar6 = (char *)0x8;
          }
          (aVar2.p)->identifier = pcVar6;
          pgVar4 = (gravity_value_t *)realloc(pgVar4,(long)pcVar6 << 4);
          *(gravity_value_t **)&(aVar2.p)->has_outer = pgVar4;
          pcVar7 = (char *)((gravity_value_r *)&(aVar2.p)->objclass)->n;
        }
        uVar9 = (int)pcVar3 - (int)s;
        ((gravity_value_r *)&(aVar2.p)->objclass)->n = (size_t)(pcVar7 + 1);
        gVar11 = gravity_string_to_value(vm,(char *)s,uVar9);
        pgVar4[(long)pcVar7].isa = gVar11.isa;
        pgVar4[(long)pcVar7].field_1.n = (gravity_int_t)gVar11.field_1;
        s = (gravity_class_t *)(pcVar3 + uVar10);
        len = (int)slen - (uVar9 + uVar10);
        slen = (ulong)len;
        pcVar3 = string_strnstr((char *)s,(char *)pgVar8,slen);
      }
      pcVar3 = (char *)((gravity_value_r *)&(aVar2.p)->objclass)->n;
      if (pcVar3 == (aVar2.p)->identifier) {
        pcVar7 = (char *)0x8;
        if (pcVar3 != (char *)0x0) {
          pcVar7 = (char *)((long)pcVar3 * 2);
        }
        (aVar2.p)->identifier = pcVar7;
        pgVar4 = (gravity_value_t *)
                 realloc(*(gravity_value_t **)&(aVar2.p)->has_outer,(long)pcVar7 << 4);
        *(gravity_value_t **)&(aVar2.p)->has_outer = pgVar4;
        pcVar3 = (char *)((gravity_value_r *)&(aVar2.p)->objclass)->n;
      }
      else {
        pgVar4 = *(gravity_value_t **)&(aVar2.p)->has_outer;
      }
      ((gravity_value_r *)&(aVar2.p)->objclass)->n = (size_t)(pcVar3 + 1);
      gVar11 = gravity_string_to_value(vm,(char *)s,len);
      pgVar4[(long)pcVar3].isa = gVar11.isa;
      pgVar4[(long)pcVar3].field_1.n = (gravity_int_t)gVar11.field_1;
      gravity_gc_setenabled(vm,true);
      pgVar8 = (aVar2.p)->isa;
    }
    value.field_1.p = (gravity_object_t *)aVar2.n;
    value.isa = pgVar8;
    gravity_vm_setslot(vm,value,rindex);
    _Var5 = true;
  }
  else {
    builtin_strncpy(local_1038 + 0x20,"separator.",0xb);
    builtin_strncpy(local_1038 + 0x10,"xpects 1 string ",0x10);
    builtin_strncpy(local_1038,"String.split() e",0x10);
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1038);
    _Var5 = false;
    gVar11.field_1.n = 0;
    gVar11.isa = gravity_class_null;
    gravity_vm_setslot(vm,gVar11,rindex);
  }
  return _Var5;
}

Assistant:

static bool string_split (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    // sanity check
    if ((nargs != 2) || (!VALUE_ISA_STRING(GET_VALUE(1)))) RETURN_ERROR("String.split() expects 1 string separator.");

    // setup arguments
    gravity_string_t *string = VALUE_AS_STRING(GET_VALUE(0));
    gravity_string_t *substr = VALUE_AS_STRING(GET_VALUE(1));
    const char *sep = substr->s;
    uint32_t seplen = substr->len;
    
    // this is a quite complex situation
    // list should not be trasferred to GC bacause it could be freed by VALUE_FROM_STRING
    // and the same applied to each VALUE_FROM_STRING
    // but in order to use NULL as vm parameter I should keep track of each individual allocation here
    // and then transfer all of them to the VM at the end of the loop (in order to be able to have them
    // freed by the GC)
    // I think it is too much work, the easier solution is just to disable GC during execution loop
    
    gravity_gc_setenabled(vm, false);

    // initialize the list to have a size of 0
    gravity_list_t *list = gravity_list_new(vm, 0);

    char *original = string->s;
    uint32_t slen = string->len;

    // if the separator is empty, then we split the string at every character
    if (seplen == 0) {
        for (uint32_t i=0; i<slen;) {
            uint32_t n = utf8_charbytes(original, 0);
            marray_push(gravity_value_t, list->array, VALUE_FROM_STRING(vm, original, n));
            original += n;
            i += n;
        }
        gravity_gc_setenabled(vm, true);
        RETURN_VALUE(VALUE_FROM_OBJECT(list), rindex);
    }

    // split loop
    while (1) {
        char *p = string_strnstr(original, sep, (size_t)slen);
        if (p == NULL) {
			marray_push(gravity_value_t, list->array, VALUE_FROM_STRING(vm, original, slen));
            break;
        }
        uint32_t vlen = (uint32_t)(p-original);
		marray_push(gravity_value_t, list->array, VALUE_FROM_STRING(vm, original, vlen));

        // update pointer and slen
        original = p + seplen;
        slen -= vlen + seplen;
    }
    
    gravity_gc_setenabled(vm, true);
    RETURN_VALUE(VALUE_FROM_OBJECT(list), rindex);
}